

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

void __thiscall cs_impl::any::holder<cs::lang_error>::~holder(holder<cs::lang_error> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_0025f888;
  pcVar2 = (this->mDat).mWhat._M_dataplus._M_p;
  paVar1 = &(this->mDat).mWhat.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

~ holder() override = default;